

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O1

cl_uint xmrig::OclLib::getNumPlatforms(void)

{
  uint in_EAX;
  cl_int ret;
  char *pcVar1;
  cl_uint count;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  ret = (*pGetPlatformIDs)(0,(cl_platform_id *)0x0,(cl_uint *)((long)&uStack_8 + 4));
  if (ret != 0) {
    pcVar1 = OclError::toString(ret);
    Log::print(ERR,"Error %s when calling clGetPlatformIDs for number of platforms.",pcVar1);
  }
  if (uStack_8._4_4_ == 0) {
    Log::print(ERR,"No OpenCL platform found.");
  }
  return uStack_8._4_4_;
}

Assistant:

cl_uint xmrig::OclLib::getNumPlatforms() noexcept
{
    cl_uint count = 0;
    cl_int ret;

    if ((ret = OclLib::getPlatformIDs(0, nullptr, &count)) != CL_SUCCESS) {
        LOG_ERR("Error %s when calling clGetPlatformIDs for number of platforms.", OclError::toString(ret));
    }

    if (count == 0) {
        LOG_ERR("No OpenCL platform found.");
    }

    return count;
}